

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

int divbwt(uchar *T,uchar *U,int *A,int n,uchar *num_indexes,int *indexes,int openMP)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *SA;
  int *piVar6;
  int *bucket_B;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  uint *puVar13;
  ulong uVar14;
  char *pcVar15;
  int openMP_00;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  uint *puVar21;
  bool bVar22;
  
  iVar3 = -1;
  if (-1 < n && (U != (uchar *)0x0 && T != (uchar *)0x0)) {
    if (n < 2) {
      iVar3 = n;
      if (n == 1) {
        *U = *T;
      }
    }
    else {
      piVar6 = indexes;
      SA = (uint *)A;
      if (A == (int *)0x0) {
        SA = (uint *)malloc((ulong)(uint)n * 4 + 4);
      }
      openMP_00 = (int)piVar6;
      piVar6 = (int *)malloc(0x400);
      bucket_B = (int *)malloc(0x40000);
      iVar3 = -2;
      if (bucket_B != (int *)0x0 && (piVar6 != (int *)0x0 && SA != (uint *)0x0)) {
        iVar3 = sort_typeBstar(T,(int *)SA,piVar6,bucket_B,n,openMP_00);
        if (num_indexes == (uchar *)0x0 || indexes == (int *)0x0) {
          if (0 < iVar3) {
            uVar9 = 0xfe;
            do {
              uVar8 = (uint)(uVar9 << 8);
              iVar3 = bucket_B[(int)(uVar8 | (int)uVar9 + 1U)];
              puVar11 = SA + (long)piVar6[uVar9 + 1] + -1;
              if (SA + iVar3 <= puVar11) {
                uVar17 = 0xffffffff;
                puVar13 = (uint *)0x0;
                do {
                  uVar16 = *puVar11;
                  uVar19 = (ulong)uVar16;
                  if ((int)uVar16 < 1) {
                    if (uVar19 == 0) {
                      if (uVar9 != *T) {
                        __assert_fail("T[s] == c1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb6a,
                                      "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                    }
                    else {
                      *puVar11 = ~uVar16;
                    }
                  }
                  else {
                    bVar1 = T[uVar19];
                    if (uVar9 != bVar1) {
                      __assert_fail("T[s] == c1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5a,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if ((n <= (int)(uVar19 + 1)) || (T[uVar19 + 1] < bVar1)) {
                      __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5b,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if (bVar1 < T[uVar19 - 1]) {
                      __assert_fail("T[s - 1] <= T[s]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5c,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    bVar1 = T[uVar16 - 1];
                    uVar10 = (ulong)bVar1;
                    *puVar11 = ~(uint)bVar1;
                    uVar5 = 0;
                    if ((uVar19 != 1) && (uVar5 = uVar16 - 1, bVar1 < T[uVar19 - 2])) {
                      uVar5 = -uVar16;
                    }
                    if (uVar17 == bVar1) {
                      uVar10 = (ulong)uVar17;
                    }
                    else {
                      if (-1 < (int)uVar17) {
                        bucket_B[(int)(uVar17 | uVar8)] =
                             (int)((ulong)((long)puVar13 - (long)SA) >> 2);
                      }
                      puVar13 = SA + bucket_B[(long)(int)uVar8 | uVar10];
                    }
                    if (puVar11 <= puVar13) {
                      pcVar15 = "k < j";
LAB_001a5e22:
                      __assert_fail(pcVar15,
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb64,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if (puVar13 == (uint *)0x0) {
                      pcVar15 = "k != NULL";
                      goto LAB_001a5e22;
                    }
                    *puVar13 = uVar5;
                    puVar13 = puVar13 + -1;
                    uVar17 = (uint)uVar10;
                  }
                  puVar11 = puVar11 + -1;
                } while (SA + iVar3 <= puVar11);
              }
              bVar22 = uVar9 != 0;
              uVar9 = uVar9 - 1;
            } while (bVar22);
          }
          uVar9 = (ulong)T[n - 1U];
          uVar8 = ~(uint)T[(ulong)(uint)n - 2];
          if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
            uVar8 = n - 1U;
          }
          puVar11 = SA + (long)piVar6[uVar9] + 1;
          puVar11[-1] = uVar8;
          puVar13 = SA;
          puVar20 = SA;
          do {
            uVar8 = *puVar13;
            lVar18 = (long)(int)uVar8;
            if (lVar18 < 1) {
              puVar21 = puVar13;
              if (uVar8 != 0) {
                *puVar13 = ~uVar8;
                puVar21 = puVar20;
              }
            }
            else {
              if (T[lVar18 + -1] < T[lVar18]) {
                __assert_fail("T[s - 1] >= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbb78,
                              "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              bVar1 = T[uVar8 - 1];
              *puVar13 = (uint)bVar1;
              uVar17 = 0;
              if ((uVar8 != 1) && (uVar17 = uVar8 - 1, T[lVar18 + -2] < bVar1)) {
                uVar17 = ~(uint)T[lVar18 + -2];
              }
              if ((uint)uVar9 != (uint)bVar1) {
                piVar6[uVar9] = (int)((ulong)((long)puVar11 - (long)SA) >> 2);
                puVar11 = SA + piVar6[bVar1];
                uVar9 = (ulong)bVar1;
              }
              if (puVar11 <= puVar13) {
                __assert_fail("i < k",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,48000,
                              "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              *puVar11 = uVar17;
              puVar11 = puVar11 + 1;
              puVar21 = puVar20;
            }
            puVar13 = puVar13 + 1;
            puVar20 = puVar21;
          } while (puVar13 < SA + (uint)n);
        }
        else {
          uVar8 = (uint)n >> 4 | (uint)n >> 3;
          uVar8 = uVar8 >> 2 | uVar8;
          uVar8 = uVar8 >> 4 | uVar8;
          uVar8 = uVar8 >> 8 | uVar8;
          uVar16 = uVar8 >> 1 | uVar8 >> 0x11;
          uVar8 = n - 1;
          uVar17 = uVar16 + 1;
          *num_indexes = (uchar)((ulong)uVar8 / (ulong)uVar17);
          if (0 < iVar3) {
            uVar9 = 0xfe;
            do {
              uVar5 = (uint)(uVar9 << 8);
              iVar3 = bucket_B[(int)(uVar5 | (int)uVar9 + 1U)];
              if (SA + iVar3 <= SA + (long)piVar6[uVar9 + 1] + -1) {
                uVar4 = 0xffffffff;
                puVar11 = (uint *)0x0;
                uVar19 = (long)piVar6[uVar9 + 1] * 4;
                do {
                  uVar10 = uVar19 - 4;
                  puVar13 = (uint *)((long)SA + uVar10);
                  uVar2 = *(uint *)((long)SA + uVar10);
                  uVar14 = (ulong)uVar2;
                  if ((int)uVar2 < 1) {
                    if (uVar14 == 0) {
                      if (uVar9 != *T) {
                        __assert_fail("T[s] == c1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbbbe,
                                      "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                     );
                      }
                    }
                    else {
                      *puVar13 = ~uVar2;
                    }
                  }
                  else {
                    bVar1 = T[uVar14];
                    if (uVar9 != bVar1) {
                      __assert_fail("T[s] == c1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbab,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if ((n <= (int)(uVar14 + 1)) || (T[uVar14 + 1] < bVar1)) {
                      __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbac,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if (bVar1 < T[uVar14 - 1]) {
                      __assert_fail("T[s - 1] <= T[s]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbad,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if ((uVar2 & uVar16) == 0) {
                      indexes[(ulong)uVar2 / (ulong)uVar17 - 1] = (int)(uVar10 >> 2);
                    }
                    bVar1 = T[uVar2 - 1];
                    uVar7 = (ulong)bVar1;
                    *puVar13 = ~(uint)bVar1;
                    uVar12 = 0;
                    if ((uVar2 != 1) && (uVar12 = uVar2 - 1, bVar1 < T[uVar14 - 2])) {
                      uVar12 = -uVar2;
                    }
                    if (uVar4 == bVar1) {
                      uVar7 = (ulong)uVar4;
                    }
                    else {
                      if (-1 < (int)uVar4) {
                        bucket_B[(int)(uVar4 | uVar5)] =
                             (int)((ulong)((long)puVar11 - (long)SA) >> 2);
                      }
                      puVar11 = SA + bucket_B[(long)(int)uVar5 | uVar7];
                    }
                    if (puVar13 <= puVar11) {
                      pcVar15 = "k < j";
LAB_001a5e41:
                      __assert_fail(pcVar15,
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbb8,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if (puVar11 == (uint *)0x0) {
                      pcVar15 = "k != NULL";
                      goto LAB_001a5e41;
                    }
                    *puVar11 = uVar12;
                    puVar11 = puVar11 + -1;
                    uVar4 = (uint)uVar7;
                  }
                  lVar18 = uVar19 - 8;
                  uVar19 = uVar10;
                } while (SA + iVar3 <= (uint *)((long)SA + lVar18));
              }
              bVar22 = uVar9 != 0;
              uVar9 = uVar9 - 1;
            } while (bVar22);
          }
          uVar9 = (ulong)T[uVar8];
          iVar3 = piVar6[uVar9];
          if (T[(ulong)(uint)n - 2] < T[uVar8]) {
            if ((uVar16 & uVar8) == 0) {
              indexes[(long)(int)((ulong)uVar8 / (ulong)uVar17) + -1] = iVar3;
            }
            uVar8 = ~(uint)T[(ulong)(uint)n - 2];
          }
          SA[iVar3] = uVar8;
          puVar11 = SA + iVar3 + 1;
          iVar3 = 0;
          puVar13 = SA;
          puVar20 = SA;
          do {
            uVar8 = *puVar13;
            lVar18 = (long)(int)uVar8;
            if (lVar18 < 1) {
              puVar21 = puVar13;
              if (uVar8 != 0) {
                *puVar13 = ~uVar8;
                puVar21 = puVar20;
              }
            }
            else {
              if (T[lVar18 + -1] < T[lVar18]) {
                __assert_fail("T[s - 1] >= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbd3,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((uVar8 & uVar16) == 0) {
                indexes[(ulong)uVar8 / (ulong)uVar17 - 1] = iVar3;
              }
              uVar5 = uVar8 - 1;
              bVar1 = T[uVar5];
              *puVar13 = (uint)bVar1;
              if ((uint)uVar9 != (uint)bVar1) {
                piVar6[uVar9] = (int)((ulong)((long)puVar11 - (long)SA) >> 2);
                puVar11 = SA + piVar6[bVar1];
                uVar9 = (ulong)bVar1;
              }
              if (puVar11 <= puVar13) {
                __assert_fail("i < k",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbdd,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((uVar8 == 1) || (bVar1 <= T[lVar18 + -2])) {
                *puVar11 = uVar5;
              }
              else {
                if ((uVar5 & uVar16) == 0) {
                  indexes[(long)(int)(uVar5 / uVar17) + -1] =
                       (int)((ulong)((long)puVar11 - (long)SA) >> 2);
                }
                *puVar11 = ~(uint)T[lVar18 + -2];
              }
              puVar11 = puVar11 + 1;
              puVar21 = puVar20;
            }
            puVar13 = puVar13 + 1;
            iVar3 = iVar3 + 1;
            puVar20 = puVar21;
          } while (puVar13 < SA + (uint)n);
        }
        *U = T[(ulong)(uint)n - 1];
        uVar8 = (uint)((ulong)((long)puVar21 - (long)SA) >> 2);
        if ((int)uVar8 < 1) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          do {
            U[uVar9 + 1] = (uchar)SA[uVar9];
            uVar9 = uVar9 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar9);
        }
        if ((int)uVar9 + 1 < n) {
          lVar18 = 1;
          do {
            U[lVar18 + (uVar9 & 0xffffffff)] = (uchar)SA[(uVar9 & 0xffffffff) + lVar18];
            lVar18 = lVar18 + 1;
          } while ((int)uVar9 + (int)lVar18 < n);
        }
        iVar3 = uVar8 + 1;
      }
      free(bucket_B);
      free(piVar6);
      if (A == (int *)0x0) {
        free(SA);
      }
    }
  }
  return iVar3;
}

Assistant:

int
divbwt(const unsigned char *T, unsigned char *U, int *A, int n, unsigned char * num_indexes, int * indexes, int openMP) {
  int *B;
  int *bucket_A, *bucket_B;
  int m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (int *)malloc((size_t)(n + 1) * sizeof(int)); }
  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n, openMP);

    if (num_indexes == NULL || indexes == NULL) {
        pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);
    } else {
        pidx = construct_BWT_indexes(T, B, bucket_A, bucket_B, n, m, num_indexes, indexes);
    }

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (unsigned char)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (unsigned char)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}